

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp.cpp
# Opt level: O3

int lzham::lzham_lib_z_deflateReset(lzham_z_streamp pStream)

{
  lzham_z_internal_state *plVar1;
  bool bVar2;
  int iVar3;
  lzham_compress_state *pState;
  
  iVar3 = -2;
  if ((pStream != (lzham_z_streamp)0x0) &&
     (plVar1 = pStream->state, plVar1 != (lzham_z_internal_state *)0x0)) {
    bVar2 = lzcompressor::reset((lzcompressor *)(plVar1 + 0xa58));
    if (bVar2) {
      *(undefined4 *)(plVar1 + 0xc0f6b8) = 0;
      *(undefined8 *)(plVar1 + 0xc0f650) = 0;
      *(undefined8 *)(plVar1 + 0xc0f658) = 0;
      *(undefined8 *)(plVar1 + 0xc0f660) = 0;
      *(undefined8 *)(plVar1 + 0xc0f668) = 0;
      *(undefined8 *)(plVar1 + 0xc0f669) = 0;
      *(undefined8 *)(plVar1 + 0xc0f671) = 0;
      pStream->state = plVar1;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int lzham_lib_z_deflateReset(lzham_z_streamp pStream)
   {
      if (!pStream)
      {
         LZHAM_LOG_ERROR(6034);
         return LZHAM_Z_STREAM_ERROR;
      }

      lzham_compress_state_ptr pComp = (lzham_compress_state_ptr)pStream->state;
      if (!pComp)
      {
         LZHAM_LOG_ERROR(6035);
         return LZHAM_Z_STREAM_ERROR;
      }

      pComp = lzham_lib_compress_reinit(pComp);
      if (!pComp)
      {
         LZHAM_LOG_ERROR(6036);
         return LZHAM_Z_STREAM_ERROR;
      }

      pStream->state = (struct lzham_z_internal_state *)pComp;

      return LZHAM_Z_OK;
   }